

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aec_core.cc
# Opt level: O2

void webrtc::OverdriveAndSuppress(AecCore *aec,float *hNl,float hNlFb,float (*efw) [65])

{
  long lVar1;
  float fVar2;
  
  for (lVar1 = 0; lVar1 != 0x104; lVar1 = lVar1 + 4) {
    fVar2 = *(float *)((long)hNl + lVar1);
    if (hNlFb < fVar2) {
      fVar2 = fVar2 * (1.0 - *(float *)((long)&WebRtcAec_weightCurve + lVar1)) +
              *(float *)((long)&WebRtcAec_weightCurve + lVar1) * hNlFb;
      *(float *)((long)hNl + lVar1) = fVar2;
    }
    fVar2 = powf(fVar2,aec->overDriveSm * *(float *)((long)&WebRtcAec_overDriveCurve + lVar1));
    *(float *)((long)hNl + lVar1) = fVar2;
    *(float *)((long)*efw + lVar1) = fVar2 * *(float *)((long)*efw + lVar1);
    *(float *)((long)efw[1] + lVar1) =
         -*(float *)((long)efw[1] + lVar1) * *(float *)((long)hNl + lVar1);
  }
  return;
}

Assistant:

static void OverdriveAndSuppress(AecCore* aec,
                                 float hNl[PART_LEN1],
                                 const float hNlFb,
                                 float efw[2][PART_LEN1]) {
  int i;
  for (i = 0; i < PART_LEN1; i++) {
    // Weight subbands
    if (hNl[i] > hNlFb) {
      hNl[i] = WebRtcAec_weightCurve[i] * hNlFb +
               (1 - WebRtcAec_weightCurve[i]) * hNl[i];
    }
    hNl[i] = powf(hNl[i], aec->overDriveSm * WebRtcAec_overDriveCurve[i]);

    // Suppress error signal
    efw[0][i] *= hNl[i];
    efw[1][i] *= hNl[i];

    // Ooura fft returns incorrect sign on imaginary component. It matters here
    // because we are making an additive change with comfort noise.
    efw[1][i] *= -1;
  }
}